

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionRotation_spline::ChFunctionRotation_spline(ChFunctionRotation_spline *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar1 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChFunction *__tmp;
  undefined1 auVar3 [64];
  initializer_list<chrono::ChQuaternion<double>_> __l;
  vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> mrotations;
  allocator_type local_71;
  vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> local_70;
  undefined1 local_58 [64];
  
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_spline_00b46ec8;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->rotations =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>)
       SUB3224(ZEXT432(0) << 0x40,0);
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)SUB328(ZEXT432(0) << 0x40,0x18);
  auVar3 = vbroadcastf64x4_avx512f(_QUNIT);
  local_58 = vmovdqu64_avx512f(auVar3);
  __l._M_len = 2;
  __l._M_array = (iterator)local_58;
  std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::vector
            (&local_70,__l,&local_71);
  this->closed = false;
  (*(this->super_ChFunctionRotation)._vptr_ChFunctionRotation[10])(this,1,&local_70,0);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x28);
  auVar1 = vmovhps_avx((undefined1  [16])0x0,0x3ff0000000000000);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b10d00;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b458a8;
  *(undefined1 (*) [16])&p_Var2[1]._M_use_count = auVar1;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  this_00 = (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_70.
      super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ChFunctionRotation_spline::ChFunctionRotation_spline() {
    const std::vector<ChQuaternion<> > mrotations = {QUNIT, QUNIT};
	this->closed = false;
    this->SetupData(1, mrotations);

	// default s(t) function. User will provide better fx.
    space_fx = chrono_types::make_shared<ChFunction_Ramp>(0, 1.);
}